

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JnHelperMethod.cpp
# Opt level: O1

intptr_t IR::GetMethodAddress(ThreadContextInfo *context,HelperCallOpnd *opnd)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  undefined7 extraout_var;
  uintptr_t uVar5;
  intptr_t iVar6;
  DiagHelperCallOpnd *diagOpnd;
  
  if (opnd == (HelperCallOpnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/JnHelperMethod.cpp"
                       ,0x65,"(opnd)","opnd");
    if (!bVar3) goto LAB_00576a77;
    *puVar4 = 0;
  }
  bVar3 = HelperCallOpnd::IsDiagHelperCallOpnd(opnd);
  if (bVar3) {
    uVar1 = *(uint *)&opnd->field_0x14;
    if ((ulong)uVar1 < 0x11) {
      uVar5 = ShiftAddr(context,*(uintptr_t *)(helperMethodWrappers + (ulong)uVar1 * 8));
    }
    else {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/JnHelperMethod.cpp"
                         ,0x7a,"(0)","Unsupported arg count (need to implement).");
      uVar5 = CONCAT71(extraout_var,bVar3);
      if (!bVar3) {
LAB_00576a77:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
    }
    if (uVar1 < 0x11) {
      return uVar5;
    }
  }
  iVar6 = GetMethodOriginalAddress(context,opnd->m_fnHelper);
  return iVar6;
}

Assistant:

intptr_t
GetMethodAddress(ThreadContextInfo * context, IR::HelperCallOpnd* opnd)
{
    Assert(opnd);
#ifdef ENABLE_SCRIPT_DEBUGGING
#if defined(_M_ARM32_OR_ARM64)
#define LowererMDFinal LowererMD
#else
#define LowererMDFinal LowererMDArch
#endif

    CompileAssert(_countof(helperMethodWrappers) == LowererMDFinal::MaxArgumentsToHelper + 1);

    if (opnd->IsDiagHelperCallOpnd())
    {
        // Note: all arguments are already loaded for the original helper. Here we just return the address.
        IR::DiagHelperCallOpnd* diagOpnd = (IR::DiagHelperCallOpnd*)opnd;

        if (0 <= diagOpnd->m_argCount && diagOpnd->m_argCount <= LowererMDFinal::MaxArgumentsToHelper)
        {
            return ShiftAddr(context, helperMethodWrappers[diagOpnd->m_argCount]);
        }
        else
        {
            AssertMsg(FALSE, "Unsupported arg count (need to implement).");
        }
    }
#endif
    return GetMethodOriginalAddress(context, opnd->m_fnHelper);
}